

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet_tests.cpp
# Opt level: O0

void wallet::wallet_tests::TestLoadWallet
               (string *name,DatabaseFormat format,
               function<void_(std::shared_ptr<wallet::CWallet>)> *f)

{
  bool bVar1;
  DatabaseOptions *in_RDX;
  long in_FS_OFFSET;
  shared_ptr<wallet::CWallet> wallet;
  unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_> database;
  vector<bilingual_str,_std::allocator<bilingual_str>_> warnings;
  DatabaseStatus status;
  unique_ptr<interfaces::Chain,_std::default_delete<interfaces::Chain>_> chain;
  NodeContext node;
  bilingual_str error;
  DatabaseOptions options;
  char *in_stack_fffffffffffffd38;
  NodeContext *in_stack_fffffffffffffd40;
  NodeContext *in_stack_fffffffffffffd48;
  lazy_ostream *in_stack_fffffffffffffd60;
  unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>
  *in_stack_fffffffffffffd68;
  anon_class_16_2_1aae1798 *this;
  bilingual_str *error_string;
  unit_test_log_t *this_00;
  string *name_00;
  CWallet *in_stack_fffffffffffffd90;
  undefined1 local_240 [432];
  unit_test_log_t local_90 [8];
  bilingual_str local_50;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  name_00 = (string *)(local_240 + 0xa0);
  ::node::NodeContext::NodeContext(in_stack_fffffffffffffd40);
  interfaces::MakeChain(in_stack_fffffffffffffd48);
  error_string = &local_50;
  DatabaseOptions::DatabaseOptions((DatabaseOptions *)in_stack_fffffffffffffd38);
  std::optional<wallet::DatabaseFormat>::optional<wallet::DatabaseFormat_&,_true>
            ((optional<wallet::DatabaseFormat> *)in_stack_fffffffffffffd48,
             (DatabaseFormat *)in_stack_fffffffffffffd40);
  local_50.original._4_8_ = local_240._424_8_;
  this_00 = local_90;
  bilingual_str::bilingual_str((bilingual_str *)in_stack_fffffffffffffd38);
  std::vector<bilingual_str,_std::allocator<bilingual_str>_>::vector
            ((vector<bilingual_str,_std::allocator<bilingual_str>_> *)in_stack_fffffffffffffd38);
  MakeWalletDatabase(name_00,in_RDX,(DatabaseStatus *)this_00,error_string);
  local_240._88_8_ =
       std::unique_ptr<interfaces::Chain,_std::default_delete<interfaces::Chain>_>::get
                 ((unique_ptr<interfaces::Chain,_std::default_delete<interfaces::Chain>_> *)
                  in_stack_fffffffffffffd38);
  std::
  make_shared<wallet::CWallet,interfaces::Chain*,char_const(&)[1],std::unique_ptr<wallet::WalletDatabase,std::default_delete<wallet::WalletDatabase>>>
            ((Chain **)this_00,(char (*) [1])error_string,in_stack_fffffffffffffd68);
  do {
    this = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffd48,
               (pointer)in_stack_fffffffffffffd40,(unsigned_long)in_stack_fffffffffffffd38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffd38);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (this_00,(const_string *)error_string,(size_t)this,
               (const_string *)in_stack_fffffffffffffd60);
    in_stack_fffffffffffffd60 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffffd40,(char (*) [1])in_stack_fffffffffffffd38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffd48,
               (pointer)in_stack_fffffffffffffd40,(unsigned_long)in_stack_fffffffffffffd38);
    std::__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               in_stack_fffffffffffffd38);
    local_240._4_4_ = CWallet::LoadWallet(in_stack_fffffffffffffd90);
    local_240._0_4_ = 0;
    in_stack_fffffffffffffd48 = (NodeContext *)0x1cdfcb1;
    in_stack_fffffffffffffd40 = (NodeContext *)local_240;
    in_stack_fffffffffffffd38 = "wallet->LoadWallet()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,wallet::DBErrors,wallet::DBErrors>
              (local_240 + 0x18,local_240 + 8,0x1c9,1,2,local_240 + 4);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffffd38);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  std::__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_fffffffffffffd38);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffffd38);
  TestLoadWallet::anon_class_16_2_1aae1798::operator()(this);
  std::shared_ptr<wallet::CWallet>::~shared_ptr
            ((shared_ptr<wallet::CWallet> *)in_stack_fffffffffffffd38);
  std::unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>::~unique_ptr
            ((unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_> *)
             in_stack_fffffffffffffd48);
  std::vector<bilingual_str,_std::allocator<bilingual_str>_>::~vector
            ((vector<bilingual_str,_std::allocator<bilingual_str>_> *)in_stack_fffffffffffffd48);
  bilingual_str::~bilingual_str((bilingual_str *)in_stack_fffffffffffffd38);
  DatabaseOptions::~DatabaseOptions((DatabaseOptions *)in_stack_fffffffffffffd38);
  std::unique_ptr<interfaces::Chain,_std::default_delete<interfaces::Chain>_>::~unique_ptr
            ((unique_ptr<interfaces::Chain,_std::default_delete<interfaces::Chain>_> *)
             in_stack_fffffffffffffd48);
  ::node::NodeContext::~NodeContext((NodeContext *)in_stack_fffffffffffffd38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void TestLoadWallet(const std::string& name, DatabaseFormat format, std::function<void(std::shared_ptr<CWallet>)> f)
{
    node::NodeContext node;
    auto chain{interfaces::MakeChain(node)};
    DatabaseOptions options;
    options.require_format = format;
    DatabaseStatus status;
    bilingual_str error;
    std::vector<bilingual_str> warnings;
    auto database{MakeWalletDatabase(name, options, status, error)};
    auto wallet{std::make_shared<CWallet>(chain.get(), "", std::move(database))};
    BOOST_CHECK_EQUAL(wallet->LoadWallet(), DBErrors::LOAD_OK);
    WITH_LOCK(wallet->cs_wallet, f(wallet));
}